

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void R_NewWall(bool needlights)

{
  byte *pbVar1;
  double dVar2;
  side_t *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  sector_t *psVar9;
  FTexture *pFVar10;
  DVector2 *pDVar11;
  double *pdVar12;
  line_t *this;
  long lVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  
  rw_markportal = false;
  psVar3 = curline->sidedef;
  this = curline->linedef;
  sidedef = psVar3;
  linedef = this;
  if (!r_dontmaplines) {
    pbVar1 = (byte *)((long)&this->flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  psVar9 = backsector;
  bottomtexture = (FTexture *)0x0;
  toptexture = (FTexture *)0x0;
  midtexture = (FTexture *)0x0;
  if (((psVar3 == this->sidedef[0]) && (this->special == 0xb6)) && (r_drawmirrors.Value == true)) {
    rw_markportal = true;
    markceiling = true;
    markfloor = true;
  }
  else if (backsector == (sector_t *)0x0) {
    markceiling = true;
    markfloor = true;
    bVar6 = line_t::isVisualPortal(this);
    if (bVar6) {
      rw_markportal = true;
    }
    else if (linedef->special != 9) {
      midtexture = FTextureManager::operator()
                             (&TexMan,(FTextureID)sidedef->textures[1].texture.texnum,true);
      rw_offset_mid = SUB84(sidedef->textures[1].xOffset + 103079215104.0,0);
      dVar2 = sidedef->textures[1].yOffset;
      rw_midtexturescalex = sidedef->textures[1].xScale;
      rw_midtexturescaley = sidedef->textures[1].yScale;
      dVar15 = rw_midtexturescaley * (midtexture->Scale).Y;
      if (0.0 <= dVar15) {
        if ((linedef->flags & 0x10) != 0) {
          dVar16 = frontsector->planes[0].TexZ;
          goto LAB_00337264;
        }
        dVar16 = (frontsector->planes[1].TexZ - ViewPos.Z) * dVar15;
        if (dVar2 < 0.0) {
          dVar2 = dVar2 + (double)midtexture->Height;
        }
      }
      else {
        dVar2 = -dVar2;
        if ((linedef->flags & 0x10) == 0) {
          dVar16 = frontsector->planes[1].TexZ;
LAB_00337264:
          dVar16 = (double)midtexture->Height + (dVar16 - ViewPos.Z) * dVar15;
        }
        else {
          dVar16 = (frontsector->planes[0].TexZ - ViewPos.Z) * dVar15;
        }
      }
      if ((midtexture->field_0x31 & 4) != 0) {
        dVar2 = dVar2 * dVar15;
      }
      rw_midtexturemid = dVar16 + dVar2;
    }
  }
  else {
    rw_frontlowertop = frontsector->planes[1].TexZ;
    iVar8 = frontsector->planes[1].Texture.texnum;
    if ((iVar8 == skyflatnum.texnum) && (backsector->planes[1].Texture.texnum == iVar8)) {
      if (rw_havehigh == true) {
        lVar13 = (long)WallC.sx1;
        memcpy(walltop + lVar13,wallupper + lVar13,(WallC.sx2 - lVar13) * 2);
        rw_havehigh = false;
      }
      else if ((rw_havelow == true) &&
              (bVar6 = secplane_t::operator!=(&frontsector->ceilingplane,&backsector->ceilingplane),
              psVar9 = backsector, bVar6)) {
        WallMost(walltop,&backsector->ceilingplane,&WallC);
        psVar9 = backsector;
      }
      rw_frontlowertop = psVar9->planes[1].TexZ;
      this = linedef;
    }
    bVar6 = line_t::isVisualPortal(this);
    if (((bVar6) || ((rw_backcz1 <= rw_frontfz1 && (rw_backcz2 <= rw_frontfz2)))) ||
       ((rw_frontcz1 <= rw_backfz1 && (rw_frontcz2 <= rw_backfz2)))) {
      markfloor = true;
      bVar6 = true;
    }
    else {
      bVar6 = true;
      if (((((((rw_mustmarkfloor == false) &&
              (bVar4 = secplane_t::operator!=(&backsector->floorplane,&frontsector->floorplane),
              !bVar4)) && (backsector->lightlevel == frontsector->lightlevel)) &&
            ((backsector->planes[0].Texture.texnum == frontsector->planes[0].Texture.texnum &&
             (backsector->planes[0].Light == frontsector->planes[0].Light)))) &&
           ((bVar4 = FTransform::operator!=((FTransform *)backsector,(FTransform *)frontsector),
            !bVar4 && ((backsector->planes[0].alpha == frontsector->planes[0].alpha &&
                       (frontsector->heightsec == (sector_t *)0x0)))))) &&
          ((((frontsector->planes[0].Flags ^ backsector->planes[0].Flags) & 0xfffffecdU) == 0 &&
           ((backsector->ColorMap == frontsector->ColorMap &&
            ((frontsector->e == (extsector_t *)0x0 ||
             ((frontsector->e->XFloor).lightlist.Count == 0)))))))) &&
         ((backsector->e == (extsector_t *)0x0 || ((backsector->e->XFloor).lightlist.Count == 0))))
      {
        if (sidedef->textures[1].texture.texnum < 1) {
          bVar6 = false;
        }
        else if ((linedef->flags & 0x180000) == 0) {
          bVar6 = (sidedef->Flags & 0x30) != 0;
        }
      }
      iVar8 = frontsector->planes[1].Texture.texnum;
      markfloor = bVar6;
      if ((iVar8 == skyflatnum.texnum) && (backsector->planes[1].Texture.texnum == iVar8)) {
LAB_00336b58:
        bVar6 = false;
      }
      else {
        bVar4 = true;
        bVar14 = true;
        bVar6 = bVar4;
        if (((((rw_mustmarkceiling == false) &&
              (((bVar5 = secplane_t::operator!=
                                   (&backsector->ceilingplane,&frontsector->ceilingplane), !bVar5 &&
                (backsector->lightlevel == frontsector->lightlevel)) &&
               (backsector->planes[1].Texture.texnum == frontsector->planes[1].Texture.texnum)))) &&
             ((bVar5 = FTransform::operator!=
                                 (&backsector->planes[1].xform,&frontsector->planes[1].xform),
              !bVar5 && (backsector->planes[1].alpha == frontsector->planes[1].alpha)))) &&
            (((frontsector->heightsec == (sector_t *)0x0 ||
              (frontsector->planes[1].Texture.texnum == skyflatnum.texnum)) &&
             (((backsector->planes[1].Light == frontsector->planes[1].Light &&
               (bVar6 = bVar14, backsector->planes[1].Flags == frontsector->planes[1].Flags)) &&
              ((backsector->ColorMap == frontsector->ColorMap &&
               ((frontsector->e == (extsector_t *)0x0 ||
                ((frontsector->e->XFloor).lightlist.Count == 0)))))))))) &&
           ((backsector->e == (extsector_t *)0x0 ||
            (bVar6 = bVar4, (backsector->e->XFloor).lightlist.Count == 0)))) {
          if (sidedef->textures[1].texture.texnum < 1) goto LAB_00336b58;
          bVar6 = bVar14;
          if ((linedef->flags & 0x180000) == 0) {
            bVar6 = (sidedef->Flags & 0x30) != 0;
          }
        }
      }
    }
    markceiling = bVar6;
    if (rw_havehigh == true) {
      toptexture = FTextureManager::operator()
                             (&TexMan,(FTextureID)sidedef->textures[0].texture.texnum,true);
      rw_offset_top = SUB84(sidedef->textures[0].xOffset + 103079215104.0,0);
      dVar2 = sidedef->textures[0].yOffset;
      rw_toptexturescalex = sidedef->textures[0].xScale;
      rw_toptexturescaley = sidedef->textures[0].yScale;
      dVar15 = rw_toptexturescaley * (toptexture->Scale).Y;
      if (0.0 <= dVar15) {
        psVar9 = backsector;
        if ((linedef->flags & 8) == 0) goto LAB_00336ce0;
        dVar16 = (frontsector->planes[1].TexZ - ViewPos.Z) * dVar15;
        if (dVar2 < 0.0) {
          dVar2 = dVar2 + (double)toptexture->Height;
        }
      }
      else {
        dVar2 = -dVar2;
        psVar9 = frontsector;
        if ((linedef->flags & 8) == 0) {
          dVar16 = (backsector->planes[1].TexZ - ViewPos.Z) * dVar15;
        }
        else {
LAB_00336ce0:
          dVar16 = (double)toptexture->Height + (psVar9->planes[1].TexZ - ViewPos.Z) * dVar15;
        }
      }
      if ((*(ushort *)&toptexture->field_0x31 & 4) != 0) {
        dVar2 = dVar2 * dVar15;
      }
      rw_toptexturemid = dVar16 + dVar2;
    }
    if (rw_havelow != false) {
      bottomtexture =
           FTextureManager::operator()(&TexMan,(FTextureID)sidedef->textures[2].texture.texnum,true)
      ;
      rw_offset_bottom = SUB84(sidedef->textures[2].xOffset + 103079215104.0,0);
      dVar2 = sidedef->textures[2].yOffset;
      rw_bottomtexturescalex = sidedef->textures[2].xScale;
      rw_bottomtexturescaley = sidedef->textures[2].yScale;
      dVar15 = rw_bottomtexturescaley * (bottomtexture->Scale).Y;
      if (0.0 <= dVar15) {
        if ((linedef->flags & 0x10) != 0) goto LAB_00336e1b;
        dVar16 = (backsector->planes[0].TexZ - ViewPos.Z) * dVar15;
        if (dVar2 < 0.0) {
          dVar2 = dVar2 + (double)bottomtexture->Height;
        }
      }
      else {
        dVar2 = -dVar2;
        if ((linedef->flags & 0x10) == 0) {
          dVar16 = (double)bottomtexture->Height + (backsector->planes[0].TexZ - ViewPos.Z) * dVar15
          ;
        }
        else {
LAB_00336e1b:
          dVar16 = (rw_frontlowertop - ViewPos.Z) * dVar15;
        }
      }
      if ((bottomtexture->field_0x31 & 4) != 0) {
        dVar2 = dVar2 * dVar15;
      }
      rw_bottomtexturemid = dVar16 + dVar2;
    }
    rw_markportal = line_t::isVisualPortal(linedef);
  }
  psVar9 = sector_t::GetHeightSec(frontsector);
  if (psVar9 == (sector_t *)0x0) {
    iVar7 = secplane_t::PointOnSide(&frontsector->floorplane,&ViewPos);
    pdVar12 = &(frontsector->floorplane).normal.Z;
    iVar8 = -iVar7;
    if (0.0 < *pdVar12 || *pdVar12 == 0.0) {
      iVar8 = iVar7;
    }
    if (iVar8 < 1) {
      markfloor = false;
    }
    if (frontsector->planes[1].Texture.texnum != skyflatnum.texnum) {
      iVar7 = secplane_t::PointOnSide(&frontsector->ceilingplane,&ViewPos);
      iVar8 = -iVar7;
      if ((frontsector->ceilingplane).normal.Z <= 0.0) {
        iVar8 = iVar7;
      }
      if (iVar8 < 1) {
        markceiling = false;
      }
    }
  }
  pFVar10 = FTextureManager::operator()
                      (&TexMan,(FTextureID)sidedef->textures[1].texture.texnum,true);
  if (pFVar10 == (FTexture *)0x0 && toptexture == (FTexture *)0x0) {
    if (!needlights) {
      return;
    }
    if (bottomtexture == (FTexture *)0x0) {
      if (backsector == (sector_t *)0x0) {
        return;
      }
      bVar6 = IsFogBoundary(frontsector,backsector);
      if (!bVar6) {
        return;
      }
      goto LAB_00336f79;
    }
LAB_00336f42:
    pDVar11 = &bottomtexture->Scale;
    pdVar12 = &sidedef->textures[2].xScale;
  }
  else {
    if (!needlights) {
      return;
    }
    if (pFVar10 == (FTexture *)0x0) {
LAB_00336f79:
      if (toptexture == (FTexture *)0x0) {
        if (bottomtexture == (FTexture *)0x0) {
          lwallscale = 1.0;
          goto LAB_00336f99;
        }
        goto LAB_00336f42;
      }
      pDVar11 = &toptexture->Scale;
      pdVar12 = &sidedef->textures[0].xScale;
    }
    else {
      pDVar11 = &pFVar10->Scale;
      pdVar12 = &sidedef->textures[1].xScale;
    }
  }
  lwallscale = *pdVar12 * pDVar11->X;
LAB_00336f99:
  PrepWall(swall,lwall,(double)sidedef->TexelLength * lwallscale,(int)WallC.sx1,(int)WallC.sx2);
  if ((fixedcolormap == (lighttable_t *)0x0) && (fixedlightlev < 0)) {
    iVar8 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)frontsector->lightlevel,false,(int *)0x0);
    wallshade = (iVar8 + r_actualextralight) * -0x4000 + 0x3d0000;
    GlobVis = r_WallVisibility;
    rw_lightleft = (float)(r_WallVisibility / (double)WallC.sz1);
    rw_lightstep = (float)((r_WallVisibility / (double)WallC.sz2 - (double)rw_lightleft) /
                          (double)((int)WallC.sx2 - (int)WallC.sx1));
  }
  else {
    rw_lightleft = 1.0;
    rw_lightstep = 0.0;
  }
  return;
}

Assistant:

void R_NewWall (bool needlights)
{
	double rowoffset;
	double yrepeat;

	rw_markportal = false;

	sidedef = curline->sidedef;
	linedef = curline->linedef;

	// mark the segment as visible for auto map
	if (!r_dontmaplines) linedef->flags |= ML_MAPPED;

	midtexture = toptexture = bottomtexture = 0;

	if (sidedef == linedef->sidedef[0] &&
		(linedef->special == Line_Mirror && r_drawmirrors)) // [ZZ] compatibility with r_drawmirrors cvar that existed way before portals
	{
		markfloor = markceiling = true; // act like a one-sided wall here (todo: check how does this work with transparency)
		rw_markportal = true;
	}
	else if (backsector == NULL)
	{
		// single sided line
		// a single sided line is terminal, so it must mark ends
		markfloor = markceiling = true;
		// [RH] Horizon lines do not need to be textured
		if (linedef->isVisualPortal())
		{
			rw_markportal = true;
		}
		else if (linedef->special != Line_Horizon)
		{
			midtexture = TexMan(sidedef->GetTexture(side_t::mid), true);
			rw_offset_mid = FLOAT2FIXED(sidedef->GetTextureXOffset(side_t::mid));
			rowoffset = sidedef->GetTextureYOffset(side_t::mid);
			rw_midtexturescalex = sidedef->GetTextureXScale(side_t::mid);
			rw_midtexturescaley = sidedef->GetTextureYScale(side_t::mid);
			yrepeat = midtexture->Scale.Y * rw_midtexturescaley;
			if (yrepeat >= 0)
			{ // normal orientation
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // bottom of texture at bottom
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat + midtexture->GetHeight();
				}
				else
				{ // top of texture at top
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat;
					if (rowoffset < 0 && midtexture != NULL)
					{
						rowoffset += midtexture->GetHeight();
					}
				}
			}
			else
			{ // upside down
				rowoffset = -rowoffset;
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // top of texture at bottom
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat;
				}
				else
				{ // bottom of texture at top
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat + midtexture->GetHeight();
				}
			}
			if (midtexture->bWorldPanning)
			{
				rw_midtexturemid += rowoffset * yrepeat;
			}
			else
			{
				// rowoffset is added outside the multiply so that it positions the texture
				// by texels instead of world units.
				rw_midtexturemid += rowoffset;
			}
		}
	}
	else
	{ // two-sided line
		// hack to allow height changes in outdoor areas

		rw_frontlowertop = frontsector->GetPlaneTexZ(sector_t::ceiling);

		if (frontsector->GetTexture(sector_t::ceiling) == skyflatnum &&
			backsector->GetTexture(sector_t::ceiling) == skyflatnum)
		{
			if (rw_havehigh)
			{ // front ceiling is above back ceiling
				memcpy (&walltop[WallC.sx1], &wallupper[WallC.sx1], (WallC.sx2 - WallC.sx1)*sizeof(walltop[0]));
				rw_havehigh = false;
			}
			else if (rw_havelow && frontsector->ceilingplane != backsector->ceilingplane)
			{ // back ceiling is above front ceiling
				// The check for rw_havelow is not Doom-compliant, but it avoids HoM that
				// would otherwise occur because there is space made available for this
				// wall but nothing to draw for it.
				// Recalculate walltop so that the wall is clipped by the back sector's
				// ceiling instead of the front sector's ceiling.
				WallMost (walltop, backsector->ceilingplane, &WallC);
			}
			// Putting sky ceilings on the front and back of a line alters the way unpegged
			// positioning works.
			rw_frontlowertop = backsector->GetPlaneTexZ(sector_t::ceiling);
		}

		if (linedef->isVisualPortal())
		{
			markceiling = markfloor = true;
		}
		else if ((rw_backcz1 <= rw_frontfz1 && rw_backcz2 <= rw_frontfz2) ||
				 (rw_backfz1 >= rw_frontcz1 && rw_backfz2 >= rw_frontcz2))
		{
			// closed door
			markceiling = markfloor = true;
		}
		else
		{
			markfloor = rw_mustmarkfloor
				|| backsector->floorplane != frontsector->floorplane
				|| backsector->lightlevel != frontsector->lightlevel
				|| backsector->GetTexture(sector_t::floor) != frontsector->GetTexture(sector_t::floor)
				|| backsector->GetPlaneLight(sector_t::floor) != frontsector->GetPlaneLight(sector_t::floor)

				// killough 3/7/98: Add checks for (x,y) offsets
				|| backsector->planes[sector_t::floor].xform != frontsector->planes[sector_t::floor].xform
				|| backsector->GetAlpha(sector_t::floor) != frontsector->GetAlpha(sector_t::floor)

				// killough 4/15/98: prevent 2s normals
				// from bleeding through deep water
				|| frontsector->heightsec

				|| backsector->GetVisFlags(sector_t::floor) != frontsector->GetVisFlags(sector_t::floor)

				// [RH] Add checks for colormaps
				|| backsector->ColorMap != frontsector->ColorMap


				// kg3D - add fake lights
				|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
				|| (backsector->e && backsector->e->XFloor.lightlist.Size())

				|| (sidedef->GetTexture(side_t::mid).isValid() &&
					((linedef->flags & (ML_CLIP_MIDTEX|ML_WRAP_MIDTEX)) ||
					 (sidedef->Flags & (WALLF_CLIP_MIDTEX|WALLF_WRAP_MIDTEX))))
				;

			markceiling = (frontsector->GetTexture(sector_t::ceiling) != skyflatnum ||
				backsector->GetTexture(sector_t::ceiling) != skyflatnum) &&
				(rw_mustmarkceiling
				|| backsector->ceilingplane != frontsector->ceilingplane
				|| backsector->lightlevel != frontsector->lightlevel
				|| backsector->GetTexture(sector_t::ceiling) != frontsector->GetTexture(sector_t::ceiling)

				// killough 3/7/98: Add checks for (x,y) offsets
				|| backsector->planes[sector_t::ceiling].xform != frontsector->planes[sector_t::ceiling].xform
				|| backsector->GetAlpha(sector_t::ceiling) != frontsector->GetAlpha(sector_t::ceiling)

				// killough 4/15/98: prevent 2s normals
				// from bleeding through fake ceilings
				|| (frontsector->heightsec && frontsector->GetTexture(sector_t::ceiling) != skyflatnum)

				|| backsector->GetPlaneLight(sector_t::ceiling) != frontsector->GetPlaneLight(sector_t::ceiling)
				|| backsector->GetFlags(sector_t::ceiling) != frontsector->GetFlags(sector_t::ceiling)

				// [RH] Add check for colormaps
				|| backsector->ColorMap != frontsector->ColorMap

				// kg3D - add fake lights
				|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
				|| (backsector->e && backsector->e->XFloor.lightlist.Size())

				|| (sidedef->GetTexture(side_t::mid).isValid() &&
					((linedef->flags & (ML_CLIP_MIDTEX|ML_WRAP_MIDTEX)) ||
					(sidedef->Flags & (WALLF_CLIP_MIDTEX|WALLF_WRAP_MIDTEX))))
				);
		}

		if (rw_havehigh)
		{ // top texture
			toptexture = TexMan(sidedef->GetTexture(side_t::top), true);

			rw_offset_top = FLOAT2FIXED(sidedef->GetTextureXOffset(side_t::top));
			rowoffset = sidedef->GetTextureYOffset(side_t::top);
			rw_toptexturescalex =sidedef->GetTextureXScale(side_t::top);
			rw_toptexturescaley =sidedef->GetTextureYScale(side_t::top);
			yrepeat = toptexture->Scale.Y * rw_toptexturescaley;
			if (yrepeat >= 0)
			{ // normal orientation
				if (linedef->flags & ML_DONTPEGTOP)
				{ // top of texture at top
					rw_toptexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat;
					if (rowoffset < 0 && toptexture != NULL)
					{
						rowoffset += toptexture->GetHeight();
					}
				}
				else
				{ // bottom of texture at bottom
					rw_toptexturemid = (backsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat + toptexture->GetHeight();
				}
			}
			else
			{ // upside down
				rowoffset = -rowoffset;
				if (linedef->flags & ML_DONTPEGTOP)
				{ // bottom of texture at top
					rw_toptexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat + toptexture->GetHeight();
				}
				else
				{ // top of texture at bottom
					rw_toptexturemid = (backsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat;
				}
			}
			if (toptexture->bWorldPanning)
			{
				rw_toptexturemid += rowoffset * yrepeat;
			}
			else
			{
				rw_toptexturemid += rowoffset;
			}
		}
		if (rw_havelow)
		{ // bottom texture
			bottomtexture = TexMan(sidedef->GetTexture(side_t::bottom), true);

			rw_offset_bottom = FLOAT2FIXED(sidedef->GetTextureXOffset(side_t::bottom));
			rowoffset = sidedef->GetTextureYOffset(side_t::bottom);
			rw_bottomtexturescalex = sidedef->GetTextureXScale(side_t::bottom);
			rw_bottomtexturescaley = sidedef->GetTextureYScale(side_t::bottom);
			yrepeat = bottomtexture->Scale.Y * rw_bottomtexturescaley;
			if (yrepeat >= 0)
			{ // normal orientation
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // bottom of texture at bottom
					rw_bottomtexturemid = (rw_frontlowertop - ViewPos.Z) * yrepeat;
				}
				else
				{ // top of texture at top
					rw_bottomtexturemid = (backsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat;
					if (rowoffset < 0 && bottomtexture != NULL)
					{
						rowoffset += bottomtexture->GetHeight();
					}
				}
			}
			else
			{ // upside down
				rowoffset = -rowoffset;
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // top of texture at bottom
					rw_bottomtexturemid = (rw_frontlowertop - ViewPos.Z) * yrepeat;
				}
				else
				{ // bottom of texture at top
					rw_bottomtexturemid = (backsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat + bottomtexture->GetHeight();
				}
			}
			if (bottomtexture->bWorldPanning)
			{
				rw_bottomtexturemid += rowoffset * yrepeat;
			}
			else
			{
				rw_bottomtexturemid += rowoffset;
			}
		}
		rw_markportal = linedef->isVisualPortal();
	}

	// if a floor / ceiling plane is on the wrong side of the view plane,
	// it is definitely invisible and doesn't need to be marked.

	// killough 3/7/98: add deep water check
	if (frontsector->GetHeightSec() == NULL)
	{
		int planeside;

		planeside = frontsector->floorplane.PointOnSide(ViewPos);
		if (frontsector->floorplane.fC() < 0)	// 3D floors have the floor backwards
			planeside = -planeside;
		if (planeside <= 0)		// above view plane
			markfloor = false;

		if (frontsector->GetTexture(sector_t::ceiling) != skyflatnum)
		{
			planeside = frontsector->ceilingplane.PointOnSide(ViewPos);
			if (frontsector->ceilingplane.fC() > 0)	// 3D floors have the ceiling backwards
				planeside = -planeside;
			if (planeside <= 0)		// below view plane
				markceiling = false;
		}
	}

	FTexture *midtex = TexMan(sidedef->GetTexture(side_t::mid), true);

	segtextured = midtex != NULL || toptexture != NULL || bottomtexture != NULL;

	// calculate light table
	if (needlights && (segtextured || (backsector && IsFogBoundary(frontsector, backsector))))
	{
		lwallscale =
			midtex ? (midtex->Scale.X * sidedef->GetTextureXScale(side_t::mid)) :
			toptexture ? (toptexture->Scale.X * sidedef->GetTextureXScale(side_t::top)) :
			bottomtexture ? (bottomtexture->Scale.X * sidedef->GetTextureXScale(side_t::bottom)) :
			1.;

		PrepWall (swall, lwall, sidedef->TexelLength * lwallscale, WallC.sx1, WallC.sx2);

		if (fixedcolormap == NULL && fixedlightlev < 0)
		{
			wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, frontsector->lightlevel)
				+ r_actualextralight);
			GlobVis = r_WallVisibility;
			rw_lightleft = float (GlobVis / WallC.sz1);
			rw_lightstep = float((GlobVis / WallC.sz2 - rw_lightleft) / (WallC.sx2 - WallC.sx1));
		}
		else
		{
			rw_lightleft = 1;
			rw_lightstep = 0;
		}
	}
}